

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint RDL_getRCPrototypes(RDL_data *data,RDL_cycle ***ptr)

{
  uint uVar1;
  RDL_BCCGraph *pRVar2;
  uint *puVar3;
  RDL_URFinfo **ppRVar4;
  RDL_graph **ppRVar5;
  char *pcVar6;
  RDL_graph *pRVar7;
  RDL_node *pRVar8;
  RDL_cycle **ppRVar9;
  RDL_cycle *pRVar10;
  RDL_edge *paRVar11;
  ulong uVar12;
  RDL_cfam **ppRVar13;
  uint uVar14;
  ulong uVar15;
  RDL_URFinfo *pRVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppRVar9 = (RDL_cycle **)malloc(8);
    uVar23 = 0xffffffff;
  }
  else if (data->nofURFs == 0) {
    ppRVar9 = (RDL_cycle **)malloc(8);
    uVar23 = 0;
  }
  else {
    pRVar2 = data->bccGraphs;
    uVar21 = (ulong)pRVar2->nof_bcc;
    if (uVar21 == 0) {
      uVar23 = 0;
      ppRVar9 = (RDL_cycle **)malloc(0);
    }
    else {
      uVar12 = 0;
      uVar23 = 0;
      do {
        if ((ulong)data->nofURFsPerBCC[uVar12] != 0) {
          uVar18 = 0;
          do {
            uVar23 = (ulong)((int)uVar23 + data->urfInfoPerBCC[uVar12]->nofCFsPerURF[uVar18]);
            uVar18 = uVar18 + 1;
          } while (data->nofURFsPerBCC[uVar12] != uVar18);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar21);
      ppRVar9 = (RDL_cycle **)malloc(uVar23 << 3);
      if (uVar21 != 0) {
        puVar3 = data->nofURFsPerBCC;
        uVar12 = 0;
        uVar14 = 0;
        uVar20 = 0;
        do {
          uVar1 = puVar3[uVar12];
          if ((ulong)uVar1 != 0) {
            ppRVar4 = data->urfInfoPerBCC;
            pRVar16 = ppRVar4[uVar12];
            uVar18 = 0;
            do {
              if (pRVar16->nofCFsPerURF[uVar18] != 0) {
                ppRVar5 = pRVar2->bcc_graphs;
                ppRVar13 = pRVar16->URFs[uVar18];
                uVar22 = 0;
                do {
                  pcVar6 = ppRVar13[uVar22]->prototype;
                  pRVar10 = (RDL_cycle *)malloc(0x18);
                  ppRVar9[uVar14] = pRVar10;
                  paRVar11 = (RDL_edge *)malloc((ulong)pRVar16->URFs[uVar18][uVar22]->weight << 3);
                  pRVar10->edges = paRVar11;
                  pRVar16 = ppRVar4[uVar12];
                  ppRVar13 = pRVar16->URFs[uVar18];
                  pRVar10->weight = ppRVar13[uVar22]->weight;
                  pRVar10->urf = (uint)uVar18;
                  pRVar10->rcf = uVar20;
                  pRVar7 = ppRVar5[uVar12];
                  uVar19 = pRVar7->E;
                  if (uVar19 != 0) {
                    uVar15 = 0;
                    uVar17 = 0;
                    do {
                      if (pcVar6[uVar15] == '\x01') {
                        pRVar8 = data->graph->edges[pRVar2->edge_from_bcc_mapping[uVar12][uVar15]];
                        paRVar11[uVar17][0] = *pRVar8;
                        paRVar11[uVar17][1] = pRVar8[1];
                        uVar17 = uVar17 + 1;
                        uVar19 = pRVar7->E;
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < uVar19);
                  }
                  uVar14 = uVar14 + 1;
                  uVar22 = uVar22 + 1;
                  uVar20 = uVar20 + 1;
                } while (uVar22 < pRVar16->nofCFsPerURF[uVar18]);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar21);
      }
    }
  }
  *ptr = ppRVar9;
  return (uint)uVar23;
}

Assistant:

unsigned RDL_getRCPrototypes(const RDL_data *data, RDL_cycle ***ptr)
{
  RDL_cycle **result;
  unsigned nof_urf;
  unsigned nofRel=0, rcf=0;
  unsigned currFam=0, currEdge;
  unsigned i,j,k;
  const char* prototype;
  unsigned bcc_index, mapped_edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    for (j = 0; j < data->nofURFsPerBCC[i]; ++j) {
      nofRel += data->urfInfoPerBCC[i]->nofCFsPerURF[j];
    }
  }

  /*allocate space*/
  result = malloc(nofRel * sizeof(*result));

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    nof_urf = data->nofURFsPerBCC[bcc_index];
    for (i = 0; i < nof_urf; ++i) {
      for (j = 0; j < data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[i]; ++j, ++rcf) {
        prototype = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->prototype;
        result[currFam] = malloc(sizeof(**result));
        result[currFam]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight *
                                  sizeof(*result[currFam]->edges));
        result[currFam]->weight = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight;
        result[currFam]->urf = i;
        result[currFam]->rcf = rcf;
        currEdge = 0;
        for (k = 0; k < data->bccGraphs->bcc_graphs[bcc_index]->E; ++k) {
          if (prototype[k] == 1) {
            mapped_edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][k];
            result[currFam]->edges[currEdge][0] = data->graph->edges[mapped_edge][0];
            result[currFam]->edges[currEdge][1] = data->graph->edges[mapped_edge][1];
            ++currEdge;
          }
        }
        ++currFam;
      }
    }
  }

  (*ptr) = result;
  return nofRel;
}